

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  IReferenceCounters *Ptr;
  RefCountersImpl *pRVar1;
  
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  this->m_pObject = pObj;
  if (pObj != (ShaderResourceBindingVkImpl *)0x0) {
    Ptr = RefCountedObject<Diligent::IShaderResourceBindingVk>::GetReferenceCounters
                    ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)pObj);
    pRVar1 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>(Ptr);
    this->m_pRefCounters = pRVar1;
    LOCK();
    (pRVar1->m_NumWeakReferences).super___atomic_base<int>._M_i =
         (pRVar1->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(T* pObj) noexcept :
        m_pRefCounters{nullptr},
        m_pObject{pObj}
    {
        if (m_pObject)
        {
            m_pRefCounters = ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters());
            m_pRefCounters->AddWeakRef();
        }
    }